

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void leveldb::SaveValue(void *arg,Slice *ikey,Slice *v)

{
  ulong uVar1;
  int iVar2;
  char *local_30;
  long local_28;
  ulong local_20;
  uint local_18;
  
  uVar1 = ikey->size_;
  if (7 < uVar1) {
    local_30 = ikey->data_;
    local_18 = (uint)*(ulong *)(local_30 + (uVar1 - 8)) & 0xff;
    local_20 = *(ulong *)(local_30 + (uVar1 - 8)) >> 8;
    local_28 = uVar1 - 8;
    if (local_18 < 2) {
      iVar2 = (**(code **)(**(long **)((long)arg + 8) + 0x10))
                        (*(long **)((long)arg + 8),&local_30,(long)arg + 0x10);
      if (iVar2 != 0) {
        return;
      }
      *(uint *)arg = (local_18 != 1) + 1;
      if (local_18 != 1) {
        return;
      }
      std::__cxx11::string::_M_replace
                (*(ulong *)((long)arg + 0x20),0,*(char **)(*(ulong *)((long)arg + 0x20) + 8),
                 (ulong)v->data_);
      return;
    }
  }
  *(undefined4 *)arg = 3;
  return;
}

Assistant:

static void SaveValue(void* arg, const Slice& ikey, const Slice& v) {
  Saver* s = reinterpret_cast<Saver*>(arg);
  ParsedInternalKey parsed_key;
  if (!ParseInternalKey(ikey, &parsed_key)) {
    s->state = kCorrupt;
  } else {
    if (s->ucmp->Compare(parsed_key.user_key, s->user_key) == 0) {
      s->state = (parsed_key.type == kTypeValue) ? kFound : kDeleted;
      if (s->state == kFound) {
        s->value->assign(v.data(), v.size());
      }
    }
  }
}